

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int memdbOpen(sqlite3_vfs *pVfs,char *zName,sqlite3_file *pFd,int flags,int *pOutFlags)

{
  bool bVar1;
  int iVar2;
  size_t sVar3;
  sqlite3_io_methods *p;
  void *pvVar4;
  sqlite3_mutex *psVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  sqlite3_mutex *local_50;
  
  pFd->pMethods = (sqlite3_io_methods *)0x0;
  pFd[1].pMethods = (sqlite3_io_methods *)0x0;
  pFd[2].pMethods = (sqlite3_io_methods *)0x0;
  if (zName == (char *)0x0) {
LAB_001c023b:
    p = (sqlite3_io_methods *)sqlite3Malloc(0x48);
    if (p == (sqlite3_io_methods *)0x0) {
      return 7;
    }
    p->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
    p->xSync = (_func_int_sqlite3_file_ptr_int *)0x0;
    p->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
    p->xLock = (_func_int_sqlite3_file_ptr_int *)0x0;
    p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    p->xWrite = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    *(undefined8 *)p = 0;
    p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
    p->xUnlock = (_func_int_sqlite3_file_ptr_int *)0x0;
    *(undefined4 *)((long)&p->xSync + 4) = 3;
    p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)sqlite3Config.mxMemdbSize;
  }
  else {
    sVar3 = strlen(zName);
    uVar8 = (uint)sVar3 & 0x3fffffff;
    if ((uVar8 < 2) || (*zName != '/')) goto LAB_001c023b;
    if ((sqlite3Config.bCoreMutex == '\0') ||
       (local_50 = (*sqlite3Config.mutex.xMutexAlloc)(0xb), local_50 == (sqlite3_mutex *)0x0)) {
      bVar1 = true;
      local_50 = (sqlite3_mutex *)0x0;
    }
    else {
      (*sqlite3Config.mutex.xMutexEnter)(local_50);
      bVar1 = false;
    }
    pvVar4 = memdb_g_1;
    lVar7 = (long)memdb_g_0;
    if (0 < lVar7) {
      lVar6 = 0;
      do {
        p = *(sqlite3_io_methods **)((long)pvVar4 + lVar6 * 8);
        iVar2 = strcmp((char *)p->xUnlock,zName);
        if (iVar2 == 0) {
          if ((sqlite3_mutex *)p->xTruncate != (sqlite3_mutex *)0x0) {
            (*sqlite3Config.mutex.xMutexEnter)((sqlite3_mutex *)p->xTruncate);
          }
          *(int *)&p->xLock = *(int *)&p->xLock + 1;
          goto LAB_001c03fa;
        }
        lVar6 = lVar6 + 1;
      } while (lVar7 != lVar6);
    }
    p = (sqlite3_io_methods *)sqlite3Malloc((ulong)(uVar8 + 0x4b));
    if (p == (sqlite3_io_methods *)0x0) {
LAB_001c03cb:
      iVar2 = 7;
      if (bVar1) {
        return 7;
      }
      goto LAB_001c02a2;
    }
    pvVar4 = sqlite3Realloc(memdb_g_1,(long)memdb_g_0 * 8 + 8);
    if (pvVar4 == (void *)0x0) {
LAB_001c03c3:
      sqlite3_free(p);
      goto LAB_001c03cb;
    }
    lVar7 = (long)memdb_g_0;
    memdb_g_0 = memdb_g_0 + 1;
    *(sqlite3_io_methods **)((long)pvVar4 + lVar7 * 8) = p;
    memdb_g_1 = pvVar4;
    p->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
    p->xSync = (_func_int_sqlite3_file_ptr_int *)0x0;
    p->xFileSize = (_func_int_sqlite3_file_ptr_sqlite3_int64_ptr *)0x0;
    p->xLock = (_func_int_sqlite3_file_ptr_int *)0x0;
    p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    p->xWrite = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)0x0;
    *(undefined8 *)p = 0;
    p->xClose = (_func_int_sqlite3_file_ptr *)0x0;
    p->xUnlock = (_func_int_sqlite3_file_ptr_int *)0x0;
    *(undefined4 *)((long)&p->xSync + 4) = 3;
    p->xRead = (_func_int_sqlite3_file_ptr_void_ptr_int_sqlite3_int64 *)sqlite3Config.mxMemdbSize;
    p->xUnlock = (_func_int_sqlite3_file_ptr_int *)&p->xCheckReservedLock;
    memcpy(&p->xCheckReservedLock,zName,(ulong)(uVar8 + 1));
    iVar2 = sqlite3_initialize();
    if (iVar2 != 0) {
      p->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)0x0;
LAB_001c03bd:
      memdb_g_0 = memdb_g_0 + -1;
      goto LAB_001c03c3;
    }
    psVar5 = (*sqlite3Config.mutex.xMutexAlloc)(0);
    p->xTruncate = (_func_int_sqlite3_file_ptr_sqlite3_int64 *)psVar5;
    if (psVar5 == (sqlite3_mutex *)0x0) goto LAB_001c03bd;
    *(undefined4 *)&p->xLock = 1;
    (*sqlite3Config.mutex.xMutexEnter)(psVar5);
LAB_001c03fa:
    if (!bVar1) {
      (*sqlite3Config.mutex.xMutexLeave)(local_50);
    }
  }
  pFd[1].pMethods = p;
  if (pOutFlags != (int *)0x0) {
    *pOutFlags = flags | 0x80;
  }
  pFd->pMethods = &memdb_io_methods;
  local_50 = (sqlite3_mutex *)p->xTruncate;
  iVar2 = 0;
  if (local_50 == (sqlite3_mutex *)0x0) {
    return 0;
  }
LAB_001c02a2:
  (*sqlite3Config.mutex.xMutexLeave)(local_50);
  return iVar2;
}

Assistant:

static int memdbOpen(
  sqlite3_vfs *pVfs,
  const char *zName,
  sqlite3_file *pFd,
  int flags,
  int *pOutFlags
){
  MemFile *pFile = (MemFile*)pFd;
  MemStore *p = 0;
  int szName;
  UNUSED_PARAMETER(pVfs);

  memset(pFile, 0, sizeof(*pFile));
  szName = sqlite3Strlen30(zName);
  if( szName>1 && zName[0]=='/' ){
    int i;
#ifndef SQLITE_MUTEX_OMIT
    sqlite3_mutex *pVfsMutex = sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_VFS1);
#endif
    sqlite3_mutex_enter(pVfsMutex);
    for(i=0; i<memdb_g.nMemStore; i++){
      if( strcmp(memdb_g.apMemStore[i]->zFName,zName)==0 ){
        p = memdb_g.apMemStore[i];
        break;
      }
    }
    if( p==0 ){
      MemStore **apNew;
      p = sqlite3Malloc( sizeof(*p) + szName + 3 );
      if( p==0 ){
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      apNew = sqlite3Realloc(memdb_g.apMemStore,
                             sizeof(apNew[0])*(memdb_g.nMemStore+1) );
      if( apNew==0 ){
        sqlite3_free(p);
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      apNew[memdb_g.nMemStore++] = p;
      memdb_g.apMemStore = apNew;
      memset(p, 0, sizeof(*p));
      p->mFlags = SQLITE_DESERIALIZE_RESIZEABLE|SQLITE_DESERIALIZE_FREEONCLOSE;
      p->szMax = sqlite3GlobalConfig.mxMemdbSize;
      p->zFName = (char*)&p[1];
      memcpy(p->zFName, zName, szName+1);
      p->pMutex = sqlite3_mutex_alloc(SQLITE_MUTEX_FAST);
      if( p->pMutex==0 ){
        memdb_g.nMemStore--;
        sqlite3_free(p);
        sqlite3_mutex_leave(pVfsMutex);
        return SQLITE_NOMEM;
      }
      p->nRef = 1;
      memdbEnter(p);
    }else{
      memdbEnter(p);
      p->nRef++;
    }
    sqlite3_mutex_leave(pVfsMutex);
  }else{
    p = sqlite3Malloc( sizeof(*p) );
    if( p==0 ){
      return SQLITE_NOMEM;
    }
    memset(p, 0, sizeof(*p));
    p->mFlags = SQLITE_DESERIALIZE_RESIZEABLE | SQLITE_DESERIALIZE_FREEONCLOSE;
    p->szMax = sqlite3GlobalConfig.mxMemdbSize;
  }
  pFile->pStore = p;
  if( pOutFlags!=0 ){
    *pOutFlags = flags | SQLITE_OPEN_MEMORY;
  }
  pFd->pMethods = &memdb_io_methods;
  memdbLeave(p);
  return SQLITE_OK;
}